

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_spec_constant_default_value_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::SetSpecConstantDefaultValuePass::Process(SetSpecConstantDefaultValuePass *this)

{
  Op OVar1;
  Module *pMVar2;
  Instruction *this_00;
  char *__s1;
  int *piVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  EncodeNumberStatus EVar7;
  DefUseManager *pDVar8;
  Instruction *def;
  Instruction *pIVar9;
  const_iterator cVar10;
  TypeManager *pTVar11;
  Type *pTVar12;
  undefined4 extraout_var;
  const_iterator cVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int *piVar15;
  Operand *pOVar16;
  pointer extraout_RAX;
  pointer puVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint32_t i;
  uint uVar22;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  uint32_t spec_id;
  undefined8 local_a0;
  NumberType local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bit_pattern;
  
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = &(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_a0 = 0;
LAB_0045f1ef:
  do {
    do {
      this_00 = *(Instruction **)((long)this_00 + 8);
      if (this_00 ==
          &(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
        return (byte)local_a0 & 1 ^ SuccessWithoutChange;
      }
    } while (((this_00->opcode_ != OpDecorate) ||
             ((int)(((long)(this_00->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30) != 3)) ||
            (uVar5 = Instruction::GetSingleWordInOperand(this_00,1), uVar5 != 1));
    spec_id = Instruction::GetSingleWordOperand(this_00,2);
    uVar5 = Instruction::GetSingleWordOperand(this_00,0);
    pDVar8 = Pass::get_def_use_mgr(&this->super_Pass);
    def = analysis::DefUseManager::GetDef(pDVar8,uVar5);
  } while (def == (Instruction *)0x0);
  if (def->opcode_ == OpDecorationGroup) goto code_r0x0045f275;
  goto LAB_0045f345;
code_r0x0045f275:
  pDVar8 = Pass::get_def_use_mgr(&this->super_Pass);
  bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90._8_8_ = 0;
  local_90._M_unused._M_object = &bit_pattern;
  local_78 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/set_spec_constant_default_value_pass.cpp:163:34)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/set_spec_constant_default_value_pass.cpp:163:34)>
             ::_M_manager;
  bVar4 = analysis::DefUseManager::WhileEachUser
                    (pDVar8,def,(function<bool_(spvtools::opt::Instruction_*)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,3);
  }
  if (bVar4) goto LAB_0045f1ef;
  def = (Instruction *)0x0;
  for (uVar22 = 1;
      uVar5 = Instruction::NumInOperands
                        ((Instruction *)
                         bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start), uVar22 < uVar5;
      uVar22 = uVar22 + 1) {
    uVar5 = Instruction::GetSingleWordInOperand
                      ((Instruction *)
                       bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,uVar22);
    pIVar9 = analysis::DefUseManager::GetDef(pDVar8,uVar5);
    if (pIVar9 != (Instruction *)0x0) {
      if (def == (Instruction *)0x0) {
        def = pIVar9;
        if (2 < pIVar9->opcode_ - OpSpecConstantTrue) goto LAB_0045f1ef;
      }
      else if (pIVar9 != def) goto LAB_0045f1ef;
    }
  }
  if (def == (Instruction *)0x0) goto LAB_0045f1ef;
LAB_0045f345:
  bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->spec_id_to_value_str_)._M_h._M_element_count == 0) {
    cVar13 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->spec_id_to_value_bit_pattern_)._M_h,&spec_id);
    if (cVar13.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_0045f827;
    pTVar11 = IRContext::get_type_mgr((this->super_Pass).context_);
    uVar5 = Instruction::type_id(def);
    pTVar12 = analysis::TypeManager::GetType(pTVar11,uVar5);
    local_c8._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = (*pTVar12->_vptr_Type[8])(pTVar12);
    if (CONCAT44(extraout_var_00,iVar6) == 0) {
      iVar6 = (*pTVar12->_vptr_Type[10])(pTVar12);
      lVar19 = CONCAT44(extraout_var_03,iVar6);
      if (lVar19 == 0) {
        iVar6 = (*pTVar12->_vptr_Type[0xc])(pTVar12);
        if (CONCAT44(extraout_var_05,iVar6) != 0) {
          uVar22 = *(uint *)(CONCAT44(extraout_var_05,iVar6) + 0x24);
          uVar14 = 0x20;
          if (0x20 < uVar22) {
            uVar14 = (ulong)uVar22;
          }
          if ((*(long *)((long)cVar13.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                               ._M_cur + 0x18) -
              *(long *)((long)cVar13.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                              ._M_cur + 0x10)) * 8 == uVar14) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)cVar13.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                              ._M_cur + 0x10));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,&local_90);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
            if (uVar22 < 0x20) {
              *local_c8._M_impl.super__Vector_impl_data._M_start =
                   *local_c8._M_impl.super__Vector_impl_data._M_start &
                   ~(-1 << ((byte)uVar22 & 0x1f));
            }
          }
        }
      }
      else {
        uVar22 = *(uint *)(lVar19 + 0x24);
        if (uVar22 == 0) {
          __assert_fail("width > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/set_spec_constant_default_value_pass.cpp"
                        ,0x67,
                        "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::ParseDefaultValueBitPattern(const std::vector<uint32_t> &, const analysis::Type *)"
                       );
        }
        uVar14 = 0x20;
        if (0x20 < uVar22) {
          uVar14 = (ulong)uVar22;
        }
        if ((*(long *)((long)cVar13.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                             ._M_cur + 0x18) -
            *(long *)((long)cVar13.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                            ._M_cur + 0x10)) * 8 == uVar14) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)cVar13.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                            ._M_cur + 0x10));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,&local_90);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
          if (uVar22 < 0x20) {
            uVar18 = *local_c8._M_impl.super__Vector_impl_data._M_start;
            if ((*(char *)(lVar19 + 0x28) == '\x01') &&
               (uVar20 = (uint)(1 << ((byte)uVar22 & 0x1f)) >> 1, (uVar18 & uVar20) != 0)) {
              uVar18 = uVar18 | -uVar20;
            }
            else {
              uVar18 = uVar18 & ~(-1 << ((byte)uVar22 & 0x1f));
            }
            *local_c8._M_impl.super__Vector_impl_data._M_start = uVar18;
          }
        }
      }
    }
    else {
      piVar15 = *(int **)((long)cVar13.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                ._M_cur + 0x10);
      piVar3 = *(int **)((long)cVar13.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                               ._M_cur + 0x18);
      lVar19 = (long)piVar3 - (long)piVar15;
      for (lVar21 = lVar19 >> 4; 0 < lVar21; lVar21 = lVar21 + -1) {
        if (*piVar15 != 0) goto LAB_0045f768;
        if (piVar15[1] != 0) {
          piVar15 = piVar15 + 1;
          goto LAB_0045f768;
        }
        if (piVar15[2] != 0) {
          piVar15 = piVar15 + 2;
          goto LAB_0045f768;
        }
        if (piVar15[3] != 0) {
          piVar15 = piVar15 + 3;
          goto LAB_0045f768;
        }
        piVar15 = piVar15 + 4;
        lVar19 = lVar19 + -0x10;
      }
      lVar19 = lVar19 >> 2;
      if (lVar19 == 1) {
LAB_0045f74f:
        if (*piVar15 == 0) {
          piVar15 = piVar3;
        }
LAB_0045f768:
        if (piVar15 == piVar3) goto LAB_0045f777;
        local_90._0_4_ = 1;
      }
      else {
        if (lVar19 == 2) {
LAB_0045f746:
          if (*piVar15 == 0) {
            piVar15 = piVar15 + 1;
            goto LAB_0045f74f;
          }
          goto LAB_0045f768;
        }
        if (lVar19 == 3) {
          if (*piVar15 == 0) {
            piVar15 = piVar15 + 1;
            goto LAB_0045f746;
          }
          goto LAB_0045f768;
        }
LAB_0045f777:
        local_90._M_unused._M_member_pointer = (ulong)(uint)local_90._4_4_ << 0x20;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,
                 (uint *)local_90._M_pod_data);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&bit_pattern);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c8);
  }
  else {
    cVar10 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->spec_id_to_value_str_)._M_h,&spec_id);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_0045f827;
    __s1 = *(char **)((long)cVar10.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 0x10);
    pTVar11 = IRContext::get_type_mgr((this->super_Pass).context_);
    uVar5 = Instruction::type_id(def);
    pTVar12 = analysis::TypeManager::GetType(pTVar11,uVar5);
    local_c8._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = strcmp(__s1,"true");
    if ((iVar6 == 0) &&
       (iVar6 = (*pTVar12->_vptr_Type[8])(pTVar12), CONCAT44(extraout_var_01,iVar6) != 0)) {
      local_90._0_4_ = 1;
LAB_0045f507:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,
                 (uint *)local_90._M_pod_data);
    }
    else {
      iVar6 = strcmp(__s1,"false");
      if ((iVar6 == 0) &&
         (iVar6 = (*pTVar12->_vptr_Type[8])(pTVar12), CONCAT44(extraout_var_02,iVar6) != 0)) {
        local_90._M_unused._M_member_pointer =
             local_90._M_unused._M_member_pointer & 0xffffffff00000000;
        goto LAB_0045f507;
      }
      local_98.bitwidth = 0x20;
      local_98.kind = SPV_NUMBER_UNSIGNED_INT;
      iVar6 = (*pTVar12->_vptr_Type[10])(pTVar12);
      lVar19 = CONCAT44(extraout_var,iVar6);
      if (lVar19 == 0) {
        iVar6 = (*pTVar12->_vptr_Type[0xc])(pTVar12);
        if (CONCAT44(extraout_var_04,iVar6) != 0) {
          local_98.bitwidth = *(uint32_t *)(CONCAT44(extraout_var_04,iVar6) + 0x24);
          local_98.kind = SPV_NUMBER_FLOATING;
          goto LAB_0045f604;
        }
      }
      else {
        local_98.bitwidth = *(uint32_t *)(lVar19 + 0x24);
        local_98.kind = *(byte *)(lVar19 + 0x28) + SPV_NUMBER_UNSIGNED_INT;
LAB_0045f604:
        local_90._M_unused._M_object = &local_c8;
        local_90._8_8_ = 0;
        local_78 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/set_spec_constant_default_value_pass.cpp:66:28)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/set_spec_constant_default_value_pass.cpp:66:28)>
                   ::_M_manager;
        EVar7 = utils::ParseAndEncodeNumber
                          (__s1,&local_98,(function<void_(unsigned_int)> *)&local_90,(string *)0x0);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,3);
        }
        if ((EVar7 != kSuccess) &&
           (local_c8._M_impl.super__Vector_impl_data._M_finish !=
            local_c8._M_impl.super__Vector_impl_data._M_start)) {
          local_c8._M_impl.super__Vector_impl_data._M_finish =
               local_c8._M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&bit_pattern);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c8);
  }
  if (bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0045f827;
  OVar1 = def->opcode_;
  puVar17 = bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (OVar1 == OpSpecConstantTrue) {
    if (*bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start != 0) goto LAB_0045f827;
    def->opcode_ = OpSpecConstantFalse;
  }
  else if (OVar1 == OpSpecConstantFalse) {
    if (*bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start == 0) goto LAB_0045f827;
    def->opcode_ = OpSpecConstantTrue;
  }
  else {
    if (OVar1 != OpSpecConstant) goto LAB_0045f827;
    pOVar16 = Instruction::GetInOperand(def,0);
    bVar4 = utils::operator!=(&pOVar16->words,&bit_pattern);
    if (!bVar4) goto LAB_0045f827;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&local_90,&bit_pattern);
    Instruction::SetInOperand(def,0,(OperandData *)&local_90);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&local_90)
    ;
    puVar17 = extraout_RAX;
  }
  local_a0 = CONCAT71((int7)((ulong)puVar17 >> 8),1);
LAB_0045f827:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bit_pattern.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  goto LAB_0045f1ef;
}

Assistant:

Pass::Status SetSpecConstantDefaultValuePass::Process() {
  // The operand index of decoration target in an OpDecorate instruction.
  constexpr uint32_t kTargetIdOperandIndex = 0;
  // The operand index of the decoration literal in an OpDecorate instruction.
  constexpr uint32_t kDecorationOperandIndex = 1;
  // The operand index of Spec id literal value in an OpDecorate SpecId
  // instruction.
  constexpr uint32_t kSpecIdLiteralOperandIndex = 2;
  // The number of operands in an OpDecorate SpecId instruction.
  constexpr uint32_t kOpDecorateSpecIdNumOperands = 3;
  // The in-operand index of the default value in a OpSpecConstant instruction.
  constexpr uint32_t kOpSpecConstantLiteralInOperandIndex = 0;

  bool modified = false;
  // Scan through all the annotation instructions to find 'OpDecorate SpecId'
  // instructions. Then extract the decoration target of those instructions.
  // The decoration targets should be spec constant defining instructions with
  // opcode: OpSpecConstant{|True|False}. The spec id of those spec constants
  // will be used to look up their new default values in the mapping from
  // spec id to new default value strings. Once a new default value string
  // is found for a spec id, the string will be parsed according to the target
  // spec constant type. The parsed value will be used to replace the original
  // default value of the target spec constant.
  for (Instruction& inst : context()->annotations()) {
    // Only process 'OpDecorate SpecId' instructions
    if (inst.opcode() != spv::Op::OpDecorate) continue;
    if (inst.NumOperands() != kOpDecorateSpecIdNumOperands) continue;
    if (inst.GetSingleWordInOperand(kDecorationOperandIndex) !=
        uint32_t(spv::Decoration::SpecId)) {
      continue;
    }

    // 'inst' is an OpDecorate SpecId instruction.
    uint32_t spec_id = inst.GetSingleWordOperand(kSpecIdLiteralOperandIndex);
    uint32_t target_id = inst.GetSingleWordOperand(kTargetIdOperandIndex);

    // Find the spec constant defining instruction. Note that the
    // target_id might be a decoration group id.
    Instruction* spec_inst = nullptr;
    if (Instruction* target_inst = get_def_use_mgr()->GetDef(target_id)) {
      if (target_inst->opcode() == spv::Op::OpDecorationGroup) {
        spec_inst =
            GetSpecIdTargetFromDecorationGroup(*target_inst, get_def_use_mgr());
      } else {
        spec_inst = target_inst;
      }
    } else {
      continue;
    }
    if (!spec_inst) continue;

    // Get the default value bit pattern for this spec id.
    std::vector<uint32_t> bit_pattern;

    if (spec_id_to_value_str_.size() != 0) {
      // Search for the new string-form default value for this spec id.
      auto iter = spec_id_to_value_str_.find(spec_id);
      if (iter == spec_id_to_value_str_.end()) {
        continue;
      }

      // Gets the string of the default value and parses it to bit pattern
      // with the type of the spec constant.
      const std::string& default_value_str = iter->second;
      bit_pattern = ParseDefaultValueStr(
          default_value_str.c_str(),
          context()->get_type_mgr()->GetType(spec_inst->type_id()));

    } else {
      // Search for the new bit-pattern-form default value for this spec id.
      auto iter = spec_id_to_value_bit_pattern_.find(spec_id);
      if (iter == spec_id_to_value_bit_pattern_.end()) {
        continue;
      }

      // Gets the bit-pattern of the default value from the map directly.
      bit_pattern = ParseDefaultValueBitPattern(
          iter->second,
          context()->get_type_mgr()->GetType(spec_inst->type_id()));
    }

    if (bit_pattern.empty()) continue;

    // Update the operand bit patterns of the spec constant defining
    // instruction.
    switch (spec_inst->opcode()) {
      case spv::Op::OpSpecConstant:
        // If the new value is the same with the original value, no
        // need to do anything. Otherwise update the operand words.
        if (spec_inst->GetInOperand(kOpSpecConstantLiteralInOperandIndex)
                .words != bit_pattern) {
          spec_inst->SetInOperand(kOpSpecConstantLiteralInOperandIndex,
                                  std::move(bit_pattern));
          modified = true;
        }
        break;
      case spv::Op::OpSpecConstantTrue:
        // If the new value is also 'true', no need to change anything.
        // Otherwise, set the opcode to OpSpecConstantFalse;
        if (!static_cast<bool>(bit_pattern.front())) {
          spec_inst->SetOpcode(spv::Op::OpSpecConstantFalse);
          modified = true;
        }
        break;
      case spv::Op::OpSpecConstantFalse:
        // If the new value is also 'false', no need to change anything.
        // Otherwise, set the opcode to OpSpecConstantTrue;
        if (static_cast<bool>(bit_pattern.front())) {
          spec_inst->SetOpcode(spv::Op::OpSpecConstantTrue);
          modified = true;
        }
        break;
      default:
        break;
    }
    // No need to update the DefUse manager, as this pass does not change any
    // ids.
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}